

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tracker_manager.hpp
# Opt level: O1

void __thiscall
libtorrent::aux::tracker_request::tracker_request(tracker_request *this,tracker_request *param_1)

{
  pointer pcVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var2;
  int64_t iVar3;
  int64_t iVar4;
  int64_t iVar5;
  int64_t iVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  context *pcVar10;
  uint16_t uVar11;
  event_t eVar12;
  tracker_request_flags_t tVar13;
  uint32_t uVar14;
  bool bVar15;
  undefined6 uVar16;
  
  (this->url)._M_dataplus._M_p = (pointer)&(this->url).field_2;
  pcVar1 = (param_1->url)._M_dataplus._M_p;
  ::std::__cxx11::string::_M_construct<char*>
            ((string *)this,pcVar1,pcVar1 + (param_1->url)._M_string_length);
  (this->trackerid)._M_dataplus._M_p = (pointer)&(this->trackerid).field_2;
  pcVar1 = (param_1->trackerid)._M_dataplus._M_p;
  ::std::__cxx11::string::_M_construct<char*>
            ((string *)&this->trackerid,pcVar1,pcVar1 + (param_1->trackerid)._M_string_length);
  (this->filter).super___shared_ptr<const_libtorrent::ip_filter,_(__gnu_cxx::_Lock_policy)2>._M_ptr
       = (param_1->filter).
         super___shared_ptr<const_libtorrent::ip_filter,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  p_Var2 = (param_1->filter).
           super___shared_ptr<const_libtorrent::ip_filter,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
           _M_pi;
  (this->filter).super___shared_ptr<const_libtorrent::ip_filter,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = p_Var2;
  if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var2->_M_use_count = p_Var2->_M_use_count + 1;
      UNLOCK();
    }
    else {
      p_Var2->_M_use_count = p_Var2->_M_use_count + 1;
    }
  }
  this->num_want = param_1->num_want;
  iVar3 = param_1->downloaded;
  iVar4 = param_1->uploaded;
  iVar5 = param_1->left;
  iVar6 = param_1->corrupt;
  uVar11 = param_1->listen_port;
  eVar12 = param_1->event;
  tVar13.m_val = (param_1->kind).m_val;
  uVar14 = param_1->key;
  this->redundant = param_1->redundant;
  this->listen_port = uVar11;
  this->event = eVar12;
  this->kind = (tracker_request_flags_t)tVar13.m_val;
  this->key = uVar14;
  this->left = iVar5;
  this->corrupt = iVar6;
  this->downloaded = iVar3;
  this->uploaded = iVar4;
  ::std::vector<boost::asio::ip::address_v6,_std::allocator<boost::asio::ip::address_v6>_>::vector
            (&this->ipv6,&param_1->ipv6);
  ::std::vector<boost::asio::ip::address_v4,_std::allocator<boost::asio::ip::address_v4>_>::vector
            (&this->ipv4,&param_1->ipv4);
  *(undefined8 *)((this->pid).m_number._M_elems + 3) =
       *(undefined8 *)((param_1->pid).m_number._M_elems + 3);
  uVar7 = *(undefined8 *)(param_1->info_hash).m_number._M_elems;
  uVar8 = *(undefined8 *)((param_1->info_hash).m_number._M_elems + 2);
  uVar9 = *(undefined8 *)((param_1->pid).m_number._M_elems + 1);
  *(undefined8 *)((this->info_hash).m_number._M_elems + 4) =
       *(undefined8 *)((param_1->info_hash).m_number._M_elems + 4);
  *(undefined8 *)((this->pid).m_number._M_elems + 1) = uVar9;
  *(undefined8 *)(this->info_hash).m_number._M_elems = uVar7;
  *(undefined8 *)((this->info_hash).m_number._M_elems + 2) = uVar8;
  (this->outgoing_socket).m_sock.
  super___weak_ptr<libtorrent::aux::listen_socket_t,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (param_1->outgoing_socket).m_sock.
       super___weak_ptr<libtorrent::aux::listen_socket_t,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  p_Var2 = (param_1->outgoing_socket).m_sock.
           super___weak_ptr<libtorrent::aux::listen_socket_t,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi;
  (this->outgoing_socket).m_sock.
  super___weak_ptr<libtorrent::aux::listen_socket_t,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       p_Var2;
  if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var2->_M_weak_count = p_Var2->_M_weak_count + 1;
      UNLOCK();
    }
    else {
      p_Var2->_M_weak_count = p_Var2->_M_weak_count + 1;
    }
  }
  this->i2pconn = param_1->i2pconn;
  bVar15 = param_1->triggered_manually;
  uVar16 = *(undefined6 *)&param_1->field_0xf2;
  pcVar10 = param_1->ssl_ctx;
  this->private_torrent = param_1->private_torrent;
  this->triggered_manually = bVar15;
  *(undefined6 *)&this->field_0xf2 = uVar16;
  this->ssl_ctx = pcVar10;
  return;
}

Assistant:

struct TORRENT_EXTRA_EXPORT tracker_request
	{
		tracker_request() = default;

		static inline constexpr tracker_request_flags_t scrape_request = 0_bit;

		// affects interpretation of peers string in HTTP response
		// see parse_tracker_response()
		static inline constexpr tracker_request_flags_t i2p = 1_bit;

		std::string url;
		std::string trackerid;
#if TORRENT_ABI_VERSION == 1
		std::string auth;
#endif

		std::shared_ptr<const ip_filter> filter;

		std::int64_t downloaded = -1;
		std::int64_t uploaded = -1;
		std::int64_t left = -1;
		std::int64_t corrupt = 0;
		std::int64_t redundant = 0;
		std::uint16_t listen_port = 0;
		event_t event = event_t::none;
		tracker_request_flags_t kind = {};

		std::uint32_t key = 0;
		int num_want = 0;
		std::vector<address_v6> ipv6;
		std::vector<address_v4> ipv4;
		sha1_hash info_hash;
		peer_id pid;

		aux::listen_socket_handle outgoing_socket;

		// set to true if the .torrent file this tracker announce is for is marked
		// as private (i.e. has the "priv": 1 key)
		bool private_torrent = false;

		// this is set to true if this request was triggered by a "manual" call to
		// scrape_tracker() or force_reannounce()
		bool triggered_manually = false;

#if TORRENT_USE_SSL
		ssl::context* ssl_ctx = nullptr;
#endif
#if TORRENT_USE_I2P
		i2p_connection* i2pconn = nullptr;
#endif
#if TORRENT_USE_RTC
		std::vector<aux::rtc_offer> offers;
#endif
	}